

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_destructor(yyParser *yypParser,uchar yymajor,YYMINORTYPE *yypminor)

{
  Parse *pPVar1;
  Parse *pParse;
  YYMINORTYPE *yypminor_local;
  uchar yymajor_local;
  yyParser *yypParser_local;
  
  pPVar1 = yypParser->pParse;
  switch(yymajor) {
  case 0xa3:
  case 0xc2:
  case 0xc3:
  case 0xce:
    sqlite3SelectDelete(pPVar1->db,yypminor->yy243);
    break;
  default:
    break;
  case 0xac:
  case 0xad:
    sqlite3ExprDelete(pPVar1->db,yypminor->yy72);
    break;
  case 0xb1:
  case 0xba:
  case 0xbb:
  case 199:
  case 0xca:
  case 0xcc:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xda:
  case 0xe0:
  case 0xe2:
    sqlite3ExprListDelete(pPVar1->db,yypminor->yy148);
    break;
  case 0xc1:
  case 200:
  case 0xd3:
  case 0xd4:
    sqlite3SrcListDelete(pPVar1->db,yypminor->yy185);
    break;
  case 0xc4:
  case 0xfa:
    sqlite3WithDelete(pPVar1->db,yypminor->yy285);
    break;
  case 0xc9:
  case 0xcb:
  case 0xd7:
  case 0xe1:
  case 0xe3:
  case 0xec:
  case 0xf1:
    sqlite3ExprDelete(pPVar1->db,yypminor->yy72);
    break;
  case 0xd8:
  case 0xd9:
  case 0xdc:
    sqlite3IdListDelete(pPVar1->db,yypminor->yy254);
    break;
  case 0xe8:
  case 0xed:
    sqlite3DeleteTriggerStep(pPVar1->db,yypminor->yy145);
    break;
  case 0xea:
    sqlite3IdListDelete(pPVar1->db,(yypminor->yy332).b);
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH;
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is 
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are *not* used
    ** inside the C code.
    */
/********* Begin destructor definitions ***************************************/
    case 163: /* select */
    case 194: /* selectnowith */
    case 195: /* oneselect */
    case 206: /* values */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy243));
}
      break;
    case 172: /* term */
    case 173: /* expr */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy190).pExpr);
}
      break;
    case 177: /* eidlist_opt */
    case 186: /* sortlist */
    case 187: /* eidlist */
    case 199: /* selcollist */
    case 202: /* groupby_opt */
    case 204: /* orderby_opt */
    case 207: /* nexprlist */
    case 208: /* exprlist */
    case 209: /* sclp */
    case 218: /* setlist */
    case 224: /* paren_exprlist */
    case 226: /* case_exprlist */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy148));
}
      break;
    case 193: /* fullname */
    case 200: /* from */
    case 211: /* seltablist */
    case 212: /* stl_prefix */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy185));
}
      break;
    case 196: /* with */
    case 250: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy285));
}
      break;
    case 201: /* where_opt */
    case 203: /* having_opt */
    case 215: /* on_opt */
    case 225: /* case_operand */
    case 227: /* case_else */
    case 236: /* when_clause */
    case 241: /* key_opt */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy72));
}
      break;
    case 216: /* using_opt */
    case 217: /* idlist */
    case 220: /* idlist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy254));
}
      break;
    case 232: /* trigger_cmd_list */
    case 237: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy145));
}
      break;
    case 234: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy332).b);
}
      break;
/********* End destructor definitions *****************************************/
    default:  break;   /* If no destructor action specified: do nothing */
  }
}